

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  ValueType extraout_RDX;
  ValueType extraout_RDX_00;
  ValueType type;
  undefined1 auVar5 [16];
  string local_d0;
  interp *local_b0;
  string local_a8;
  string local_88;
  ValueType local_68;
  ValueType local_60;
  Type local_58;
  Type local_50;
  string local_48;
  string *local_28;
  string *out_msg_local;
  GlobalType *actual_local;
  GlobalType *expected_local;
  
  local_28 = out_msg;
  out_msg_local = (string *)actual;
  actual_local = expected;
  if (actual->mut != expected->mut) {
    pcVar2 = GetName(actual->mut);
    pcVar3 = GetName(actual_local->mut);
    StringPrintf_abi_cxx11_
              (&local_48,"mutability mismatch in imported global, expected %s but got %s.",pcVar2,
               pcVar3);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    Result::Result((Result *)((long)&expected_local + 4),Error);
    return (Result)expected_local._4_4_;
  }
  local_50 = *(Type *)&(actual->super_ExternType).field_0xc;
  local_58 = *(Type *)&(expected->super_ExternType).field_0xc;
  bVar1 = wabt::operator!=(local_50,local_58);
  if (bVar1) {
    type = extraout_RDX;
    if (actual_local->mut != Var) {
      local_60 = *(ValueType *)&(actual_local->super_ExternType).field_0xc;
      local_68 = *(ValueType *)((long)&out_msg_local->_M_string_length + 4);
      bVar1 = TypesMatch(local_60,local_68);
      type = extraout_RDX_00;
      if (bVar1) goto LAB_0017441d;
    }
    local_b0 = *(interp **)&(actual_local->super_ExternType).field_0xc;
    GetName_abi_cxx11_(&local_a8,local_b0,type);
    auVar5 = std::__cxx11::string::c_str();
    GetName_abi_cxx11_(&local_d0,*(interp **)((long)&out_msg_local->_M_string_length + 4),
                       auVar5._8_8_);
    uVar4 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_
              (&local_88,"type mismatch in imported global, expected %s but got %s.",auVar5._0_8_,
               uVar4);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_a8);
    Result::Result((Result *)((long)&expected_local + 4),Error);
  }
  else {
LAB_0017441d:
    Result::Result((Result *)((long)&expected_local + 4),Ok);
  }
  return (Result)expected_local._4_4_;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type).c_str(), GetName(actual.type).c_str());
    return Result::Error;
  }

  return Result::Ok;
}